

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

int Abc_SclCountMaxPhases(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  long *plVar4;
  long lVar5;
  void *__s;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  
  pVVar2 = pNtk->vObjs;
  uVar1 = pVVar2->nSize;
  uVar12 = (ulong)(int)uVar1;
  uVar7 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar7 = uVar1;
  }
  iVar8 = 0;
  if ((uVar7 == 0) || (__s = malloc((long)(int)uVar7 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,uVar12 * 4);
  }
  if (0 < (int)uVar1) {
    ppvVar3 = pVVar2->pArray;
    uVar6 = 0;
    iVar8 = 0;
    do {
      plVar4 = (long *)ppvVar3[uVar6];
      if (((plVar4 != (long *)0x0) && (uVar7 = *(uint *)((long)plVar4 + 0x14) & 0xf, uVar7 < 8)) &&
         ((0x98U >> uVar7 & 1) != 0)) {
        if ((long)*(int *)((long)plVar4 + 0x1c) < 1) {
          iVar9 = 0;
        }
        else {
          lVar10 = 0;
          iVar9 = 0;
          do {
            uVar7 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                       (long)*(int *)(plVar4[4] + lVar10 * 4) * 8) + 0x10);
            if (uVar1 <= uVar7) {
LAB_00453ce9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar5 = *(long *)(*plVar4 + 0x180);
            if (lVar5 == 0) {
              __assert_fail("p->pNtk->vPhases",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x18a,"int Abc_ObjFaninPhase(Abc_Obj_t *, int)");
            }
            iVar11 = (int)plVar4[2];
            if (((long)iVar11 < 0) || (*(int *)(lVar5 + 4) <= iVar11)) goto LAB_00453ce9;
            iVar11 = *(int *)((long)__s + (ulong)uVar7 * 4) +
                     (uint)((*(uint *)(*(long *)(lVar5 + 8) + (long)iVar11 * 4) >>
                             ((uint)lVar10 & 0x1f) & 1) != 0);
            if (iVar9 <= iVar11) {
              iVar9 = iVar11;
            }
            lVar10 = lVar10 + 1;
          } while (*(int *)((long)plVar4 + 0x1c) != lVar10);
        }
        if (uVar12 <= uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(int *)((long)__s + uVar6 * 4) = iVar9;
        if (iVar8 <= iVar9) {
          iVar8 = iVar9;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar12);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return iVar8;
}

Assistant:

int Abc_SclCountMaxPhases( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vPhLevel;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Max = 0, MaxAll = 0;
    vPhLevel = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        Max = 0;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Max = Abc_MaxInt( Max, Vec_IntEntry(vPhLevel, Abc_ObjId(pFanin)) + Abc_ObjFaninPhase(pObj, k) );
        Vec_IntWriteEntry( vPhLevel, i, Max );
        MaxAll = Abc_MaxInt( MaxAll, Max );
    }
    Vec_IntFree( vPhLevel );
    return MaxAll;
}